

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::AppendData
          (ColumnData *this,BaseStatistics *append_stats,ColumnAppendState *state,
          UnifiedVectorFormat *vdata,idx_t append_count)

{
  idx_t iVar1;
  ColumnSegment *this_00;
  idx_t offset;
  SegmentLock l;
  unique_lock<std::mutex> local_40;
  
  LOCK();
  (this->count).super___atomic_base<unsigned_long>._M_i =
       (this->count).super___atomic_base<unsigned_long>._M_i + append_count;
  UNLOCK();
  offset = 0;
  while( true ) {
    iVar1 = ColumnSegment::Append(state->current,state,vdata,offset,append_count);
    BaseStatistics::Merge(append_stats,&(state->current->stats).statistics);
    append_count = append_count - iVar1;
    if (append_count == 0) break;
    ::std::unique_lock<std::mutex>::unique_lock
              (&local_40,&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>.node_lock);
    AppendTransientSegment
              (this,(SegmentLock *)&local_40,
               (state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
               super___atomic_base<unsigned_long>._M_i +
               (state->current->super_SegmentBase<duckdb::ColumnSegment>).start);
    this_00 = SegmentTree<duckdb::ColumnSegment,_false>::GetLastSegment
                        (&(this->data).super_SegmentTree<duckdb::ColumnSegment,_false>,
                         (SegmentLock *)&local_40);
    state->current = this_00;
    ColumnSegment::InitializeAppend(this_00,state);
    ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
    offset = offset + iVar1;
  }
  return;
}

Assistant:

void ColumnData::AppendData(BaseStatistics &append_stats, ColumnAppendState &state, UnifiedVectorFormat &vdata,
                            idx_t append_count) {
	idx_t offset = 0;
	this->count += append_count;
	while (true) {
		// append the data from the vector
		idx_t copied_elements = state.current->Append(state, vdata, offset, append_count);
		append_stats.Merge(state.current->stats.statistics);
		if (copied_elements == append_count) {
			// finished copying everything
			break;
		}

		// we couldn't fit everything we wanted in the current column segment, create a new one
		{
			auto l = data.Lock();
			AppendTransientSegment(l, state.current->start + state.current->count);
			state.current = data.GetLastSegment(l);
			state.current->InitializeAppend(state);
		}
		offset += copied_elements;
		append_count -= copied_elements;
	}
}